

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall DPSprite::Destroy(DPSprite *this)

{
  DPSprite *pDVar1;
  DPSprite *pDVar2;
  TObjPtr<DPSprite> *obj;
  
  if (this->Owner != (player_t *)0x0) {
    pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)&this->Owner->psprites);
    if (pDVar1 != (DPSprite *)0x0) {
      pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)&this->Owner->psprites);
      if (pDVar1 == this) {
        (this->Owner->psprites).field_0 = (this->Next).field_0;
        pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)&this->Next);
        GC::WriteBarrier(&pDVar1->super_DObject);
      }
      else {
        obj = &this->Owner->psprites;
        do {
          pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
          if (pDVar1 == (DPSprite *)0x0) goto LAB_004c6c21;
          obj = &pDVar1->Next;
          pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
        } while (pDVar2 != this);
        pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)obj);
        if (pDVar2 == this) {
          (pDVar1->Next).field_0 = (this->Next).field_0;
          pDVar2 = GC::ReadBarrier<DPSprite>((DPSprite **)&this->Next);
          GC::WriteBarrier(&pDVar1->super_DObject,&pDVar2->super_DObject);
        }
      }
    }
  }
LAB_004c6c21:
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DPSprite::Destroy()
{
	// Do not crash if this gets called on partially initialized objects.
	if (Owner != nullptr && Owner->psprites != nullptr)
	{
		if (Owner->psprites != this)
		{
			DPSprite *prev = Owner->psprites;
			while (prev != nullptr && prev->Next != this)
				prev = prev->Next;

			if (prev != nullptr && prev->Next == this)
			{
				prev->Next = Next;
				GC::WriteBarrier(prev, Next);
			}
		}
		else
		{
			Owner->psprites = Next;
			GC::WriteBarrier(Next);
		}
	}
	Super::Destroy();
}